

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ConstraintBlockSymbol::serializeTo
          (ConstraintBlockSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  Constraint *__n;
  ASTSerializer *in_RSI;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  ConstraintBlockSymbol *in_stack_00000248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bitmask<slang::ast::ConstraintBlockFlags> in_stack_ffffffffffffff9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  void *local_28;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
  __n = getConstraints(in_stack_00000248);
  ASTSerializer::write(in_RSI,local_20,local_18,(size_t)__n);
  bVar1 = slang::bitmask::operator_cast_to_bool
                    ((bitmask<slang::ast::ConstraintBlockFlags> *)0x37c94e);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(in_RDI,(char *)in_RSI);
    this_00 = &local_50;
    flagsToStr_abi_cxx11_(in_stack_ffffffffffffff9f);
    ASTSerializer::write(local_10,local_30,local_28,(size_t)this_00);
    std::__cxx11::string::~string(this_00);
  }
  return;
}

Assistant:

void ConstraintBlockSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("constraints", getConstraints());
    if (flags)
        serializer.write("flags", flagsToStr(flags));
}